

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::maxwell_dist<float>::pdf(maxwell_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  result_type_conflict1 rVar3;
  double dVar4;
  result_type_conflict1 t2;
  result_type_conflict1 x2;
  
  rVar1 = param_type::theta(in_RDI);
  rVar2 = param_type::theta(in_RDI);
  dVar4 = std::exp((double)(ulong)(uint)(-(in_XMM0_Da * in_XMM0_Da) / (rVar1 * rVar2 * 2.0)));
  rVar3 = param_type::theta(in_RDI);
  return (in_XMM0_Da * in_XMM0_Da * 0.7978846 * SUB84(dVar4,0)) / (rVar1 * rVar2 * rVar3);
}

Assistant:

pdf(result_type x) const {
      const result_type x2{x * x};
      const result_type t2{P.theta() * P.theta()};
      return math::constants<result_type>::sqrt_2_over_pi * x2 * math::exp(-x2 / (2 * t2)) /
             (t2 * P.theta());
    }